

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

Violation mp::
          ComputeViolation<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  int i;
  CtxVal CVar1;
  pointer pdVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  Violation VVar8;
  
  i = (c->super_FunctionalConstraint).result_var_;
  pdVar2 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar6 = pdVar2[i];
  if (x->recomp_vals_ == false) {
    dVar7 = pow(pdVar2[(c->
                       super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
                       ).args_._M_elems[0]],
                (c->
                super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
                ).params_._M_elems[0]);
    dVar6 = dVar6 - dVar7;
    CVar1 = (c->super_FunctionalConstraint).ctx.value_;
    if (CVar1 != CTX_POS) {
      if (CVar1 == CTX_NEG) {
        dVar6 = -dVar6;
      }
      else {
        if (CVar1 != CTX_MIX) {
          dVar7 = 0.0;
          dVar6 = INFINITY;
          goto LAB_001cb82c;
        }
        dVar6 = ABS(dVar6);
      }
    }
  }
  else {
    dVar7 = (x->x_raw_).data_[i];
    dVar3 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::bounds_viol(x,i);
    uVar4 = SUB84(dVar3,0);
    uVar5 = (undefined4)((ulong)dVar3 >> 0x20);
    if (dVar3 <= 0.0) {
      uVar4 = 0;
      uVar5 = 0;
    }
    dVar6 = ABS(dVar6 - dVar7) + (double)CONCAT44(uVar5,uVar4);
  }
  dVar7 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[i];
LAB_001cb82c:
  VVar8.valX_ = dVar7;
  VVar8.viol_ = dVar6;
  return VVar8;
}

Assistant:

Violation ComputeViolation(
    const CustomFunctionalConstraint<Args, Params, NumOrLogic, Id>& c,
    const VarVec& x) {
  auto resvar = c.GetResultVar();
  if (!x.recomp_vals()) {    // solver's var values: normal check
    auto viol = x[resvar] - ComputeValue(c, x);
    switch (c.GetContext().GetValue()) {
    case Context::CTX_MIX:
      return {std::fabs(viol), x[resvar]};
    case Context::CTX_POS:
      return {viol, x[resvar]};
    case Context::CTX_NEG:
      return {-viol, x[resvar]};
    default:
      return {INFINITY, 0.0};
    }
  }
  return                              // recomputed var minus solver's
  { std::fabs(x[resvar] - x.raw(resvar))
        + std::max(0.0, x.bounds_viol(resvar)), x[resvar]};
}